

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O1

aom_codec_err_t
aom_codec_set_frame_buffer_functions
          (aom_codec_ctx_t *ctx,aom_get_frame_buffer_cb_fn_t cb_get,
          aom_release_frame_buffer_cb_fn_t cb_release,void *cb_priv)

{
  aom_codec_iface_t *paVar1;
  aom_codec_err_t aVar2;
  
  aVar2 = AOM_CODEC_INVALID_PARAM;
  if (((ctx != (aom_codec_ctx_t *)0x0) && (cb_get != (aom_get_frame_buffer_cb_fn_t)0x0)) &&
     (cb_release != (aom_release_frame_buffer_cb_fn_t)0x0)) {
    paVar1 = ctx->iface;
    aVar2 = AOM_CODEC_ERROR;
    if (((paVar1 != (aom_codec_iface_t *)0x0) &&
        ((aom_codec_alg_priv_t_conflict *)ctx->priv != (aom_codec_alg_priv_t_conflict *)0x0)) &&
       (aVar2 = AOM_CODEC_INCAPABLE, (paVar1->caps & 0x200000) != 0)) {
      aVar2 = (*(paVar1->dec).set_fb_fn)
                        ((aom_codec_alg_priv_t_conflict *)ctx->priv,cb_get,cb_release,cb_priv);
    }
  }
  if (ctx != (aom_codec_ctx_t *)0x0) {
    ctx->err = aVar2;
  }
  return aVar2;
}

Assistant:

aom_codec_err_t aom_codec_set_frame_buffer_functions(
    aom_codec_ctx_t *ctx, aom_get_frame_buffer_cb_fn_t cb_get,
    aom_release_frame_buffer_cb_fn_t cb_release, void *cb_priv) {
  aom_codec_err_t res;

  if (!ctx || !cb_get || !cb_release) {
    res = AOM_CODEC_INVALID_PARAM;
  } else if (!ctx->iface || !ctx->priv) {
    res = AOM_CODEC_ERROR;
  } else if (!(ctx->iface->caps & AOM_CODEC_CAP_EXTERNAL_FRAME_BUFFER)) {
    res = AOM_CODEC_INCAPABLE;
  } else {
    res = ctx->iface->dec.set_fb_fn(get_alg_priv(ctx), cb_get, cb_release,
                                    cb_priv);
  }

  return SAVE_STATUS(ctx, res);
}